

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O3

void __thiscall
fmt::v9::detail::specs_checker<fmt::v9::detail::specs_handler<char>_>::on_sign
          (specs_checker<fmt::v9::detail::specs_handler<char>_> *this,sign_t s)

{
  type tVar1;
  basic_format_specs<char> *pbVar2;
  
  tVar1 = this->arg_type_;
  if (10 < tVar1 - int_type) {
    throw_format_error("format specifier requires numeric argument");
  }
  if ((tVar1 - int_type < 8) && ((char_type < tVar1 || ((0x12aU >> (tVar1 & 0x1f) & 1) == 0)))) {
    throw_format_error("format specifier requires signed argument");
  }
  pbVar2 = (this->super_specs_handler<char>).super_specs_setter<char>.specs_;
  *(ushort *)&pbVar2->field_0x9 =
       *(ushort *)&pbVar2->field_0x9 & 0xff8f | (ushort)(byte)((s & 7) << 4);
  return;
}

Assistant:

FMT_CONSTEXPR void on_sign(sign_t s) {
    require_numeric_argument();
    if (is_integral_type(arg_type_) && arg_type_ != type::int_type &&
        arg_type_ != type::long_long_type && arg_type_ != type::int128_type &&
        arg_type_ != type::char_type) {
      this->on_error("format specifier requires signed argument");
    }
    Handler::on_sign(s);
  }